

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btHashString>::copy
          (btAlignedObjectArray<btHashString> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  btHashString *pbVar1;
  undefined8 *puVar2;
  long in_RCX;
  int i;
  btHashString *dest_local;
  int end_local;
  int start_local;
  btAlignedObjectArray<btHashString> *this_local;
  
  for (i = (int)dst; i < (int)src; i = i + 1) {
    puVar2 = (undefined8 *)(in_RCX + (long)i * 0x10);
    pbVar1 = this->m_data;
    *puVar2 = pbVar1[i].m_string;
    puVar2[1] = *(undefined8 *)&pbVar1[i].m_hash;
  }
  return i;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}